

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loclists.c
# Opt level: O0

int internal_load_loclists_contexts
              (Dwarf_Debug dbg,Dwarf_Loclists_Context **cxt,Dwarf_Unsigned *count,Dwarf_Error *error
              )

{
  Dwarf_Chain space;
  int iVar1;
  Dwarf_Loclists_Context buildhere;
  void *pvVar2;
  Dwarf_Chain prev;
  Dwarf_Loclists_Context newcontext;
  Dwarf_Unsigned i;
  Dwarf_Loclists_Context *fullarray;
  Dwarf_Unsigned chainlength;
  Dwarf_Chain *ppDStack_80;
  int res;
  Dwarf_Chain_conflict *plast;
  Dwarf_Chain head_chain;
  Dwarf_Chain curr_chain;
  Dwarf_Small *end_data;
  Dwarf_Small *startdata;
  Dwarf_Unsigned section_size;
  Dwarf_Small *data;
  Dwarf_Unsigned nextoffset;
  Dwarf_Unsigned offset;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *count_local;
  Dwarf_Loclists_Context **cxt_local;
  Dwarf_Debug dbg_local;
  
  nextoffset = 0;
  end_data = (dbg->de_debug_loclists).dss_data;
  startdata = (Dwarf_Small *)(dbg->de_debug_loclists).dss_size;
  curr_chain = (Dwarf_Chain)(end_data + (long)startdata);
  head_chain = (Dwarf_Chain)0x0;
  plast = (Dwarf_Chain_conflict *)0x0;
  ppDStack_80 = (Dwarf_Chain *)&plast;
  fullarray = (Dwarf_Loclists_Context *)0x0;
  section_size = (Dwarf_Unsigned)end_data;
  offset = (Dwarf_Unsigned)error;
  error_local = (Dwarf_Error *)count;
  count_local = (Dwarf_Unsigned *)cxt;
  cxt_local = (Dwarf_Loclists_Context **)dbg;
  while( true ) {
    data = (Dwarf_Small *)nextoffset;
    if (curr_chain <= section_size) {
      pvVar2 = malloc((long)fullarray << 3);
      if (pvVar2 == (void *)0x0) {
        free_loclists_chain((Dwarf_Debug)cxt_local,(Dwarf_Chain)plast);
        _dwarf_error_string((Dwarf_Debug)cxt_local,(Dwarf_Error *)offset,0x3e,
                            "Allocation of Loclists_Context pointer array failed");
        dbg_local._4_4_ = 1;
      }
      else {
        head_chain = (Dwarf_Chain)plast;
        for (newcontext = (Dwarf_Loclists_Context)0x0; space = head_chain, newcontext < fullarray;
            newcontext = (Dwarf_Loclists_Context)((long)&newcontext->lc_dbg + 1)) {
          *(void **)((long)pvVar2 + (long)newcontext * 8) = head_chain->ch_item;
          head_chain->ch_item = (void *)0x0;
          head_chain = head_chain->ch_next;
          dwarf_dealloc((Dwarf_Debug)cxt_local,space,0x1f);
        }
        *count_local = (Dwarf_Unsigned)pvVar2;
        *error_local = (Dwarf_Error)fullarray;
        dbg_local._4_4_ = 0;
      }
      return dbg_local._4_4_;
    }
    buildhere = (Dwarf_Loclists_Context)malloc(0x78);
    if (buildhere == (Dwarf_Loclists_Context)0x0) {
      free_loclists_chain((Dwarf_Debug)cxt_local,(Dwarf_Chain)plast);
      _dwarf_error_string((Dwarf_Debug)cxt_local,(Dwarf_Error *)offset,0x3e,
                          "DW_DLE_ALLOC_FAIL: Allocation of Loclists_Context failed");
      return 1;
    }
    memset(buildhere,0,0x78);
    iVar1 = _dwarf_internal_read_loclists_header
                      ((Dwarf_Debug)cxt_local,1,(Dwarf_Unsigned)fullarray,(Dwarf_Unsigned)startdata,
                       (Dwarf_Small *)section_size,(Dwarf_Small *)curr_chain,nextoffset,buildhere,
                       (Dwarf_Unsigned *)&data,(Dwarf_Error *)offset);
    if (iVar1 == 1) {
      free_loclists_chain((Dwarf_Debug)cxt_local,(Dwarf_Chain)plast);
      free_loclists_context(buildhere);
      return 1;
    }
    buildhere->lc_magic = 0xadab4;
    head_chain = (Dwarf_Chain)_dwarf_get_alloc((Dwarf_Debug)cxt_local,'\x1f',1);
    if (head_chain == (Dwarf_Chain)0x0) break;
    head_chain->ch_item = buildhere;
    fullarray = (Dwarf_Loclists_Context *)((long)fullarray + 1);
    *ppDStack_80 = head_chain;
    ppDStack_80 = &head_chain->ch_next;
    nextoffset = (Dwarf_Unsigned)data;
    section_size = (Dwarf_Unsigned)(end_data + (long)data);
  }
  _dwarf_error_string((Dwarf_Debug)cxt_local,(Dwarf_Error *)offset,0x3e,
                      "DW_DLE_ALLOC_FAIL: allocating Loclists_Context chain entry");
  free_loclists_chain((Dwarf_Debug)cxt_local,(Dwarf_Chain)plast);
  free_loclists_context(buildhere);
  return 1;
}

Assistant:

static int
internal_load_loclists_contexts(Dwarf_Debug dbg,
    Dwarf_Loclists_Context **cxt,
    Dwarf_Unsigned *count,
    Dwarf_Error *error)
{
    Dwarf_Unsigned offset = 0;
    Dwarf_Unsigned nextoffset = 0;
    Dwarf_Small  * data = dbg->de_debug_loclists.dss_data;
    Dwarf_Unsigned section_size = dbg->de_debug_loclists.dss_size;
    Dwarf_Small  * startdata = data;
    Dwarf_Small  * end_data = data +section_size;
    Dwarf_Chain curr_chain = 0;
    Dwarf_Chain head_chain = 0;
    Dwarf_Chain *plast = &head_chain;
    int res = 0;
    Dwarf_Unsigned chainlength = 0;
    Dwarf_Loclists_Context *fullarray = 0;
    Dwarf_Unsigned i = 0;

    for ( ; data < end_data ; data = startdata+nextoffset) {
        Dwarf_Loclists_Context newcontext = 0;

        /* sizeof the context struct, not sizeof a pointer */
        newcontext = malloc(sizeof(*newcontext));
        if (!newcontext) {
            free_loclists_chain(dbg,head_chain);
            _dwarf_error_string(dbg,error,
                DW_DLE_ALLOC_FAIL,
                "DW_DLE_ALLOC_FAIL: Allocation of "
                "Loclists_Context failed");
            return DW_DLV_ERROR;
        }
        memset(newcontext,0,sizeof(*newcontext));
        res = _dwarf_internal_read_loclists_header(dbg, TRUE,
            chainlength,
            section_size,
            data,end_data,offset,
            newcontext,&nextoffset,error);
        if (res == DW_DLV_ERROR) {
            free_loclists_chain(dbg,head_chain);
            free_loclists_context(newcontext);
            newcontext = 0;
            return DW_DLV_ERROR;
        }
        newcontext->lc_magic = LOCLISTS_MAGIC;
        curr_chain = (Dwarf_Chain)
            _dwarf_get_alloc(dbg, DW_DLA_CHAIN, 1);
        if (curr_chain == NULL) {
            _dwarf_error_string(dbg, error, DW_DLE_ALLOC_FAIL,
                "DW_DLE_ALLOC_FAIL: allocating Loclists_Context"
                " chain entry");
            free_loclists_chain(dbg,head_chain);
            free_loclists_context(newcontext);
            newcontext = 0;
            return DW_DLV_ERROR;
        }
        curr_chain->ch_item = newcontext;
        ++chainlength;
        (*plast) = curr_chain;
        plast = &(curr_chain->ch_next);
        offset = nextoffset;
    }
    fullarray= (Dwarf_Loclists_Context *)malloc(
        chainlength *sizeof(Dwarf_Loclists_Context /*pointer*/));
    if (!fullarray) {
        free_loclists_chain(dbg,head_chain);
        _dwarf_error_string(dbg,error,
            DW_DLE_ALLOC_FAIL,"Allocation of "
            "Loclists_Context pointer array failed");
        return DW_DLV_ERROR;
    }
    curr_chain = head_chain;
    for (i = 0; i < chainlength; ++i) {
        Dwarf_Chain prev = 0;
        fullarray[i] = (Dwarf_Loclists_Context)curr_chain->ch_item;
        curr_chain->ch_item = 0;
        prev = curr_chain;
        curr_chain = curr_chain->ch_next;
        dwarf_dealloc(dbg, prev, DW_DLA_CHAIN);
    }
    /*  ASSERT: the chain is entirely alloc'd
        and the array of pointers points to
        individually malloc'd Dwarf_Loclists_Context_s */
    *cxt = fullarray;
    *count = chainlength;
    return DW_DLV_OK;
}